

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O0

void mserialize::detail::visit_arithmetic<binlog::ToStringVisitor,binlog::Range>
               (char tag,ToStringVisitor *visitor,Range *istream)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char in_DIL;
  longdouble D;
  double d;
  float f;
  uint64_t L;
  uint32_t I;
  uint16_t S;
  uint8_t B;
  int64_t l;
  int32_t i;
  int16_t s;
  int8_t b;
  char c;
  bool y;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  uint8_t in_stack_ffffffffffffff1f;
  undefined2 in_stack_ffffffffffffff20;
  undefined5 in_stack_ffffffffffffff22;
  char in_stack_ffffffffffffff27;
  undefined8 in_stack_ffffffffffffff30;
  allocator *paVar1;
  undefined2 uVar2;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [136];
  
  uVar2 = (undefined2)(in_DIL + -0x42);
  switch(in_DIL + -0x42) {
  case 0:
    deserialize<unsigned_char,binlog::Range>
              ((uchar *)CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               in_stack_ffffffffffffff1f);
    break;
  default:
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    paVar1 = &local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Invalid arithmetic tag: ",paVar1);
    std::operator+(__lhs,in_stack_ffffffffffffff27);
    std::runtime_error::runtime_error((runtime_error *)__lhs,local_88);
    __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 2:
    deserialize<long_double,binlog::Range>
              ((longdouble *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit<long_double>
              ((ToStringVisitor *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (longdouble)CONCAT28(uVar2,in_stack_ffffffffffffff30));
    break;
  case 7:
    deserialize<unsigned_int,binlog::Range>
              ((uint *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit<unsigned_int>
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT13(in_stack_ffffffffffffff1f,
                        CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
    break;
  case 10:
    deserialize<unsigned_long,binlog::Range>
              ((unsigned_long *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit<unsigned_long>
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    break;
  case 0x11:
    deserialize<unsigned_short,binlog::Range>
              ((unsigned_short *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit<unsigned_short>
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT11(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff1e));
    break;
  case 0x20:
    deserialize<signed_char,binlog::Range>
              ((char *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               in_stack_ffffffffffffff1f);
    break;
  case 0x21:
    deserialize<char,binlog::Range>
              ((char *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit<char>
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               in_stack_ffffffffffffff1f);
    break;
  case 0x22:
    deserialize<double,binlog::Range>
              ((double *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit<double>
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (double)CONCAT17(in_stack_ffffffffffffff1f,
                                CONCAT16(in_stack_ffffffffffffff1e,
                                         CONCAT24(in_stack_ffffffffffffff1c,
                                                  in_stack_ffffffffffffff18))));
    break;
  case 0x24:
    deserialize<float,binlog::Range>
              ((float *)CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit<float>
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (float)CONCAT13(in_stack_ffffffffffffff1f,
                               CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
    break;
  case 0x27:
    deserialize<int,binlog::Range>
              ((int *)CONCAT17(in_stack_ffffffffffffff27,
                               CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit<int>
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT13(in_stack_ffffffffffffff1f,
                        CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
    break;
  case 0x2a:
    deserialize<long,binlog::Range>
              ((long *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit<long>
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    break;
  case 0x31:
    deserialize<short,binlog::Range>
              ((short *)CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit<short>
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT11(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff1e));
    break;
  case 0x37:
    deserialize<bool,binlog::Range>
              ((bool *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (Range *)CONCAT17(in_stack_ffffffffffffff1f,
                                 CONCAT16(in_stack_ffffffffffffff1e,
                                          CONCAT24(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18))));
    binlog::ToStringVisitor::visit<bool>
              ((ToStringVisitor *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (bool)in_stack_ffffffffffffff1f);
  }
  return;
}

Assistant:

void visit_arithmetic(char tag, Visitor& visitor, InputStream& istream)
{
  switch(tag)
  {
  case 'y': bool y; mserialize::deserialize(y, istream); visitor.visit(y); break;
  case 'c': char c; mserialize::deserialize(c, istream); visitor.visit(c); break;

  case 'b': std::int8_t  b; mserialize::deserialize(b, istream); visitor.visit(b); break;
  case 's': std::int16_t s; mserialize::deserialize(s, istream); visitor.visit(s); break;
  case 'i': std::int32_t i; mserialize::deserialize(i, istream); visitor.visit(i); break;
  case 'l': std::int64_t l; mserialize::deserialize(l, istream); visitor.visit(l); break;

  case 'B': std::uint8_t  B; mserialize::deserialize(B, istream); visitor.visit(B); break;
  case 'S': std::uint16_t S; mserialize::deserialize(S, istream); visitor.visit(S); break;
  case 'I': std::uint32_t I; mserialize::deserialize(I, istream); visitor.visit(I); break;
  case 'L': std::uint64_t L; mserialize::deserialize(L, istream); visitor.visit(L); break;

  case 'f': float f;       mserialize::deserialize(f, istream); visitor.visit(f); break;
  case 'd': double d;      mserialize::deserialize(d, istream); visitor.visit(d); break;
  case 'D': long double D; mserialize::deserialize(D, istream); visitor.visit(D); break;
  default: throw std::runtime_error(std::string("Invalid arithmetic tag: ") + tag); break;
  }
}